

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O1

Option * __thiscall
CLI::App::add_set<std::__cxx11::string>
          (App *this,string *name,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *member,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *options,string *description,bool defaulted)

{
  pointer pcVar1;
  Option *pOVar2;
  long *plVar3;
  undefined8 uVar4;
  string *description_00;
  pointer pbVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  string simple_name;
  string typeval;
  callback_t fun;
  stringstream out;
  undefined1 *local_318;
  long local_310;
  undefined1 local_308 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_2f8;
  long local_2f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2e8;
  long local_2d0;
  undefined1 local_2c8 [32];
  code *local_2a8;
  _Any_data local_298;
  code *local_288;
  undefined1 *local_278 [2];
  undefined1 local_268 [16];
  undefined1 local_258 [32];
  undefined1 local_238 [32];
  string local_218;
  undefined1 *local_1f8;
  undefined1 local_1e8 [16];
  string local_1d8;
  undefined1 local_1b8 [8];
  undefined1 local_1b0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  _Alloc_hider local_180;
  char local_170 [56];
  ios_base local_138 [264];
  
  detail::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_1b8,name,',');
  if (local_1b0 != local_1b8) {
    local_318 = local_308;
    pcVar1 = ((_Alloc_hider *)local_1b8)->_M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_318,pcVar1,pcVar1 + *(size_type *)((long)local_1b8 + 8));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1b8);
    local_1b8 = (undefined1  [8])member;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_1b0,&options->_M_t);
    local_180._M_p = local_170;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_180,local_318,local_318 + local_310);
    ::std::function<bool(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)>::
    function<CLI::App::add_set<std::__cxx11::string>(std::__cxx11::string,std::__cxx11::string&,std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>,std::__cxx11::string,bool)::_lambda(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)_1_,void>
              ((function<bool(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)>
                *)local_298._M_pod_data,(anon_class_88_3_1d669d6f *)local_1b8);
    if (local_180._M_p != local_170) {
      operator_delete(local_180._M_p);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_1b0);
    pcVar1 = (name->_M_dataplus)._M_p;
    local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_218,pcVar1,pcVar1 + name->_M_string_length);
    std::
    function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>
    ::function((function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>
                *)(local_2c8 + 0x10),
               (function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>
                *)&local_298);
    pcVar1 = (description->_M_dataplus)._M_p;
    local_238._0_8_ = (_Base_ptr)(local_238 + 0x10);
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)(local_258 + 0x20),pcVar1,pcVar1 + description->_M_string_length);
    description_00 = (string *)(local_258 + 0x20);
    pOVar2 = add_option(this,&local_218,(callback_t *)(local_2c8 + 0x10),description_00,defaulted);
    if ((_Base_ptr)local_238._0_8_ != (_Base_ptr)(local_238 + 0x10)) {
      operator_delete((void *)local_238._0_8_);
    }
    if (local_2a8 != (code *)0x0) {
      (*local_2a8)((_Any_data *)(local_2c8 + 0x10),(_Any_data *)(local_2c8 + 0x10),__destroy_functor
                  );
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p);
    }
    local_2f8 = &local_2e8;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"TEXT","");
    local_258._0_8_ = local_258 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_258,",","");
    detail::
    join<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
              (&local_1d8,(detail *)options,
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_258,description_00);
    plVar3 = (long *)::std::__cxx11::string::replace((ulong)&local_1d8,0,(char *)0x0,0x177990);
    pbVar5 = (pointer)(plVar3 + 2);
    if ((pointer)*plVar3 == pbVar5) {
      local_2c8._0_8_ = (pbVar5->_M_dataplus)._M_p;
      local_2c8._8_8_ = plVar3[3];
      local_2e8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_2c8;
    }
    else {
      local_2c8._0_8_ = (pbVar5->_M_dataplus)._M_p;
      local_2e8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*plVar3;
    }
    local_2d0 = plVar3[1];
    *plVar3 = (long)pbVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)::std::__cxx11::string::append
                               ((char *)&local_2e8.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(plVar3 + 2);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar3 == pbVar6) {
      local_1a8._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
      local_1a8._M_string_length = plVar3[3];
      local_1b8 = (undefined1  [8])&local_1a8;
    }
    else {
      local_1a8._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
      local_1b8 = (undefined1  [8])*plVar3;
    }
    local_1b0 = (undefined1  [8])plVar3[1];
    *plVar3 = (long)pbVar6;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    ::std::__cxx11::string::_M_append((char *)&local_2f8,(ulong)local_1b8);
    if (local_1b8 != (undefined1  [8])&local_1a8) {
      operator_delete((void *)local_1b8);
    }
    if (local_2e8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)local_2c8) {
      operator_delete(local_2e8.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p);
    }
    if ((undefined1 *)local_258._0_8_ != local_258 + 0x10) {
      operator_delete((void *)local_258._0_8_);
    }
    local_278[0] = local_268;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)local_278,local_2f8,
               (long)&(local_2f8->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start + local_2f0);
    ::std::__cxx11::string::_M_assign((string *)&pOVar2->typeval_);
    pOVar2->expected_ = 1;
    pOVar2->changeable_ = false;
    if (local_278[0] != local_268) {
      operator_delete(local_278[0]);
    }
    if (defaulted) {
      ::std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,(member->_M_dataplus)._M_p,member->_M_string_length);
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::_M_assign((string *)&pOVar2->defaultval_);
      if (local_1f8 != local_1e8) {
        operator_delete(local_1f8);
      }
      ::std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
      ::std::ios_base::~ios_base(local_138);
    }
    if (local_2f8 != &local_2e8) {
      operator_delete(local_2f8);
    }
    if (local_288 != (code *)0x0) {
      (*local_288)(&local_298,&local_298,__destroy_functor);
    }
    if (local_318 != local_308) {
      operator_delete(local_318);
    }
    return pOVar2;
  }
  uVar4 = ::std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0
                    );
  if (local_1f8 != local_1e8) {
    operator_delete(local_1f8);
  }
  ::std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
  ::std::ios_base::~ios_base(local_138);
  if (local_2f8 !=
      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)local_1b8) {
    operator_delete(local_2f8);
  }
  if (local_288 != (code *)0x0) {
    (*local_288)(&local_298,&local_298,__destroy_functor);
  }
  if (local_318 != local_308) {
    operator_delete(local_318);
  }
  _Unwind_Resume(uVar4);
}

Assistant:

Option *add_set(std::string name,
                    T &member,           ///< The selected member of the set
                    std::set<T> options, ///< The set of posibilities
                    std::string description,
                    bool defaulted) {

        std::string simple_name = CLI::detail::split(name, ',').at(0);
        CLI::callback_t fun = [&member, options, simple_name](CLI::results_t res) {
            bool retval = detail::lexical_cast(res[0], member);
            if(!retval)
                throw ConversionError(res[0], simple_name);
            return std::find(std::begin(options), std::end(options), member) != std::end(options);
        };

        Option *opt = add_option(name, fun, description, defaulted);
        std::string typeval = detail::type_name<T>();
        typeval += " in {" + detail::join(options) + "}";
        opt->set_custom_option(typeval);
        if(defaulted) {
            std::stringstream out;
            out << member;
            opt->set_default_str(out.str());
        }
        return opt;
    }